

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

void If_CutSortInputPins(If_Man_t *p,If_Cut_t *pCut,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  ulong uVar2;
  If_Obj_t *pIVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  for (uVar8 = 0; uVar8 < (byte)pCut->field_0x1f; uVar8 = uVar8 + 1) {
    pIVar3 = If_ManObj(p,(int)(&pCut[1].Area)[uVar8]);
    if (pIVar3 == (If_Obj_t *)0x0) break;
    pPinPerm[uVar8] = (int)uVar8;
    pPinDelays[uVar8] = (pIVar3->CutBest).Delay;
  }
  uVar8 = 1;
  for (uVar4 = 0; (long)uVar4 < (long)(int)((byte)pCut->field_0x1f - 1); uVar4 = uVar4 + 1) {
    uVar7 = uVar4 & 0xffffffff;
    for (uVar5 = uVar8; iVar6 = (int)uVar7, uVar5 < (byte)pCut->field_0x1f; uVar5 = uVar5 + 1) {
      uVar2 = uVar5 & 0xffffffff;
      if (pPinDelays[pPinPerm[uVar5]] < pPinDelays[pPinPerm[iVar6]] ||
          pPinDelays[pPinPerm[uVar5]] == pPinDelays[pPinPerm[iVar6]]) {
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
    }
    if (uVar4 != uVar7) {
      iVar1 = pPinPerm[uVar4];
      pPinPerm[uVar4] = pPinPerm[iVar6];
      pPinPerm[iVar6] = iVar1;
    }
    uVar8 = uVar8 + 1;
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void If_CutSortInputPins( If_Man_t * p, If_Cut_t * pCut, int * pPinPerm, float * pPinDelays )
{
    If_Obj_t * pLeaf;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = If_ObjCutBest(pLeaf)->Delay;
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < (int)pCut->nLeaves-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < (int)pCut->nLeaves; j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
/*
    // verify
    assert( pPinPerm[0] < (int)pCut->nLeaves );
    for ( i = 1; i < (int)pCut->nLeaves; i++ )
    {
        assert( pPinPerm[i] < (int)pCut->nLeaves );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
*/
}